

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaKrylovDemo_ls.c
# Opt level: O1

int PsetupHeat(sunrealtype tt,N_Vector uu,N_Vector up,N_Vector rr,sunrealtype c_j,void *user_data)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  
  lVar4 = N_VGetArrayPointer(tt,*(undefined8 *)((long)user_data + 0x18));
  lVar1 = *user_data;
  N_VConst(0x3ff0000000000000);
  auVar3 = _DAT_00104040;
  auVar2 = _DAT_00104030;
  if (2 < lVar1) {
    dVar10 = 1.0 / (*(double *)((long)user_data + 0x10) * 4.0 + c_j);
    lVar5 = lVar1 + -3;
    auVar8._8_4_ = (int)lVar5;
    auVar8._0_8_ = lVar5;
    auVar8._12_4_ = (int)((ulong)lVar5 >> 0x20);
    lVar5 = lVar4 + lVar1 * 8 + 0x10;
    auVar8 = auVar8 ^ _DAT_00104040;
    lVar4 = 1;
    do {
      uVar6 = 0;
      do {
        auVar9._8_4_ = (int)uVar6;
        auVar9._0_8_ = uVar6;
        auVar9._12_4_ = (int)(uVar6 >> 0x20);
        auVar9 = (auVar9 | auVar2) ^ auVar3;
        if ((bool)(~(auVar9._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar9._0_4_ ||
                    auVar8._4_4_ < auVar9._4_4_) & 1)) {
          *(double *)(lVar5 + -8 + uVar6 * 8) = dVar10;
        }
        if ((auVar9._12_4_ != auVar8._12_4_ || auVar9._8_4_ <= auVar8._8_4_) &&
            auVar9._12_4_ <= auVar8._12_4_) {
          *(double *)(lVar5 + uVar6 * 8) = dVar10;
        }
        uVar6 = uVar6 + 2;
      } while ((lVar1 - 1U & 0xfffffffffffffffe) != uVar6);
      lVar5 = lVar5 + lVar1 * 8;
      bVar7 = lVar4 != lVar1 + -2;
      lVar4 = lVar4 + 1;
    } while (bVar7);
  }
  return 0;
}

Assistant:

int PsetupHeat(sunrealtype tt, N_Vector uu, N_Vector up, N_Vector rr,
               sunrealtype c_j, void* user_data)
{
  sunindextype i, j, offset, loc, mm;
  sunrealtype *ppv, pelinv;
  UserData data;

  data = (UserData)user_data;
  ppv  = N_VGetArrayPointer(data->pp);
  mm   = data->mm;

  /* Initialize the entire vector to 1., then set the interior points to the
     correct value for preconditioning. */
  N_VConst(ONE, data->pp);

  /* Compute the inverse of the preconditioner diagonal elements. */
  pelinv = ONE / (c_j + FOUR * data->coeff);

  for (j = 1; j < mm - 1; j++)
  {
    offset = mm * j;
    for (i = 1; i < mm - 1; i++)
    {
      loc      = offset + i;
      ppv[loc] = pelinv;
    }
  }

  return (0);
}